

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O0

void PatchAlterNigelColors::fix_sword_shade(ROM *rom)

{
  allocator<unsigned_char> *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  pointer pSVar2;
  uint8_t *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5a8;
  undefined1 local_590 [8];
  Sprite nigel_frame_62;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_548;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_530;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_518;
  undefined1 local_500 [8];
  Sprite nigel_frame_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4b8;
  allocator<unsigned_char> local_49c;
  uchar local_49b [3];
  iterator local_498;
  size_type local_490;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_488;
  allocator<unsigned_char> local_46b;
  uchar local_46a [2];
  iterator local_468;
  size_type local_460;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  allocator<unsigned_char> local_43b;
  uchar local_43a [2];
  iterator local_438;
  size_type local_430;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_410;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f8;
  undefined1 local_3e0 [8];
  Sprite nigel_frame_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_398;
  undefined1 local_380 [8];
  Sprite nigel_frame_37;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  undefined1 local_320 [8];
  Sprite nigel_frame_36;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  undefined1 local_2c0 [8];
  Sprite nigel_frame_35;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  undefined1 local_260 [8];
  Sprite nigel_frame_33;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  undefined1 local_200 [8];
  Sprite nigel_frame_32;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  undefined1 local_170 [8];
  Sprite nigel_frame_23;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  undefined1 local_110 [8];
  Sprite nigel_frame_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 local_b0 [8];
  Sprite nigel_frame_16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_40 [8];
  Sprite nigel_frame_10;
  ROM *rom_local;
  
  nigel_frame_10._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rom;
  fix_sword_shade_frame(rom,0x1220ae,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x122a7c,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x122d1a,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x122f62,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x1231a0,'\v');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1233a8);
  Sprite::decode_from((Sprite *)local_40,puVar3);
  Sprite::replace_color_in_tile((Sprite *)local_40,'\t','\x06','\v');
  Sprite::set_pixel((Sprite *)local_40,'\n','\a','\x06','\x06');
  Sprite::set_pixel((Sprite *)local_40,'\n','\x06','\a','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_16._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_16._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x1233a8,&local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_68);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_16._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x123626,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x123fa8,'\v');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x124200);
  Sprite::decode_from((Sprite *)local_b0,puVar3);
  Sprite::replace_color_in_tile((Sprite *)local_b0,'\t','\x06','\v');
  Sprite::set_pixel((Sprite *)local_b0,'\v','\0','\x02','\t');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_18._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_18._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x124200,&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c8);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_18._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x124694);
  Sprite::decode_from((Sprite *)local_110,puVar3);
  Sprite::replace_color_in_tile((Sprite *)local_110,'\t','\x06','\x06');
  Sprite::set_pixel((Sprite *)local_110,'\n','\x03','\a','\x06');
  Sprite::replace_color_in_tile((Sprite *)local_110,'\t','\x06','\v');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_23._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_110);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_128,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_23._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x124694,&local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_128);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_23._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x12493c,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x124be2,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x12510a,'\x0f');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x125370);
  Sprite::decode_from((Sprite *)local_170,puVar3);
  Sprite::set_pixel((Sprite *)local_170,'\x0f','\x05','\0','\x06');
  Sprite::set_pixel((Sprite *)local_170,'\x0f','\x05','\x01','\x06');
  Sprite::set_pixel((Sprite *)local_170,'\x0f','\x06','\x01','\x06');
  Sprite::set_pixel((Sprite *)local_170,'\x0f','\x06','\x02','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)&local_1a0,(Sprite *)local_170);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_188,&local_1a0);
  md::ROM::set_bytes((ROM *)pSVar2,0x125370,&local_188);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_188);
  ByteArray::~ByteArray((ByteArray *)&local_1a0);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x125616,'\v');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  nigel_frame_32._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 10;
  nigel_frame_32._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xb;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&nigel_frame_32._subsprites.
                   super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<unsigned_char>::allocator(paVar1);
  __l_04._M_len = 2;
  __l_04._M_array =
       (iterator)
       ((long)&nigel_frame_32._subsprites.
               super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1b8,__l_04,paVar1);
  fix_sword_shade_frame((ROM *)pSVar2,0x1258c2,&local_1b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&nigel_frame_32._subsprites.
                     super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x125b70,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x125e24,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x1260da,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x126374,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x1265e8,'\v');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x126866,'\v');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x126ac4);
  Sprite::decode_from((Sprite *)local_200,puVar3);
  Sprite::set_pixel((Sprite *)local_200,'\n','\x06','\a','\x06');
  Sprite::set_pixel((Sprite *)local_200,'\v','\x05','\0','\x06');
  Sprite::set_pixel((Sprite *)local_200,'\v','\x04','\x01','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_33._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_200);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_218,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_33._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x126ac4,&local_218);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_218);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_33._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x126d66);
  Sprite::decode_from((Sprite *)local_260,puVar3);
  Sprite::set_pixel((Sprite *)local_260,'\n','\x06','\a','\x06');
  Sprite::set_pixel((Sprite *)local_260,'\v','\x05','\0','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_35._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_260);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_278,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_35._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x126d66,&local_278);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_278);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_35._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x12700c,'\v');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1272ac);
  Sprite::decode_from((Sprite *)local_2c0,puVar3);
  Sprite::set_pixel((Sprite *)local_2c0,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile((Sprite *)local_2c0,'\t','\x06','\v');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_36._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_2c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2d8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_36._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x1272ac,&local_2d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2d8);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_36._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x127546);
  Sprite::decode_from((Sprite *)local_320,puVar3);
  Sprite::set_pixel((Sprite *)local_320,'\n','\x06','\a','\x06');
  Sprite::set_pixel((Sprite *)local_320,'\v','\x05','\0','\x06');
  Sprite::set_pixel((Sprite *)local_320,'\v','\x04','\x01','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_37._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_320);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_338,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_37._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x127546,&local_338);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_338);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_37._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1277d0);
  Sprite::decode_from((Sprite *)local_380,puVar3);
  Sprite::set_pixel((Sprite *)local_380,'\n','\x05','\a','\x06');
  Sprite::set_pixel((Sprite *)local_380,'\n','\x06','\x06','\x06');
  Sprite::set_pixel((Sprite *)local_380,'\v','\x04','\0','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)
                 &nigel_frame_39._subsprites.
                  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Sprite *)local_380);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &nigel_frame_39._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  md::ROM::set_bytes((ROM *)pSVar2,0x1277d0,&local_398);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_398);
  ByteArray::~ByteArray
            ((ByteArray *)
             &nigel_frame_39._subsprites.
              super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x127a50,'\v');
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x127cc8);
  Sprite::decode_from((Sprite *)local_3e0,puVar3);
  Sprite::set_pixel((Sprite *)local_3e0,'\v','\x06','\x01','\x06');
  Sprite::set_pixel((Sprite *)local_3e0,'\v','\x05','\x02','\x06');
  Sprite::set_pixel((Sprite *)local_3e0,'\v','\x04','\x03','\x06');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)&local_410,(Sprite *)local_3e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3f8,&local_410);
  md::ROM::set_bytes((ROM *)pSVar2,0x127cc8,&local_3f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3f8);
  ByteArray::~ByteArray((ByteArray *)&local_410);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x127f28,'\n');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x128126,'\n');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x128340,'\n');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_43a[0] = '\n';
  local_43a[1] = 0xb;
  local_438 = local_43a;
  local_430 = 2;
  std::allocator<unsigned_char>::allocator(&local_43b);
  __l_03._M_len = local_430;
  __l_03._M_array = local_438;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_428,__l_03,&local_43b);
  fix_sword_shade_frame((ROM *)pSVar2,0x12859a,&local_428);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_428);
  std::allocator<unsigned_char>::~allocator(&local_43b);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x1287fa,'\n');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x128a10,'\n');
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x128c36,'\n');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_46a[0] = '\n';
  local_46a[1] = 0xb;
  local_468 = local_46a;
  local_460 = 2;
  std::allocator<unsigned_char>::allocator(&local_46b);
  __l_02._M_len = local_460;
  __l_02._M_array = local_468;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_458,__l_02,&local_46b);
  fix_sword_shade_frame((ROM *)pSVar2,0x128e6c,&local_458);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_458);
  std::allocator<unsigned_char>::~allocator(&local_46b);
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_49b[0] = '\n';
  local_49b[1] = 0xe;
  local_49b[2] = 0xf;
  local_498 = local_49b;
  local_490 = 3;
  std::allocator<unsigned_char>::allocator(&local_49c);
  __l_01._M_len = local_490;
  __l_01._M_array = local_498;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_488,__l_01,&local_49c);
  fix_sword_shade_frame((ROM *)pSVar2,0x1290c4,&local_488);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_488);
  std::allocator<unsigned_char>::~allocator(&local_49c);
  fix_sword_shade_frame
            ((ROM *)nigel_frame_10._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x129324,'\n');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  nigel_frame_60._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 6;
  nigel_frame_60._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 10;
  nigel_frame_60._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xb;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&nigel_frame_60._subsprites.
                   super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<unsigned_char>::allocator(paVar1);
  __l_00._M_len = 3;
  __l_00._M_array =
       (iterator)
       ((long)&nigel_frame_60._subsprites.
               super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_4b8,__l_00,paVar1);
  fix_sword_shade_frame((ROM *)pSVar2,0x1295d2,&local_4b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4b8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&nigel_frame_60._subsprites.
                     super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12b990);
  Sprite::decode_from((Sprite *)local_500,puVar3);
  Sprite::set_pixel((Sprite *)local_500,'\n','\x01','\a','\x06');
  Sprite::set_pixel((Sprite *)local_500,'\n','\x05','\a','\x06');
  Sprite::set_pixel((Sprite *)local_500,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile((Sprite *)local_500,'\t','\x06','\v');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)&local_530,(Sprite *)local_500);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_518,&local_530);
  md::ROM::set_bytes((ROM *)pSVar2,0x12b990,&local_518);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_518);
  ByteArray::~ByteArray((ByteArray *)&local_530);
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  nigel_frame_62._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 10;
  nigel_frame_62._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xb;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&nigel_frame_62._subsprites.
                   super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<unsigned_char>::allocator(paVar1);
  __l._M_len = 2;
  __l._M_array = (iterator)
                 ((long)&nigel_frame_62._subsprites.
                         super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_548,__l,paVar1);
  fix_sword_shade_frame((ROM *)pSVar2,0x12bb9e,&local_548);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_548);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&nigel_frame_62._subsprites.
                     super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  puVar3 = md::ROM::iterator_at
                     ((ROM *)nigel_frame_10._subsprites.
                             super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12bdfe);
  Sprite::decode_from((Sprite *)local_590,puVar3);
  Sprite::set_pixel((Sprite *)local_590,'\n','\x02','\a','\x06');
  Sprite::replace_color_in_tile((Sprite *)local_590,'\t','\x06','\v');
  pSVar2 = nigel_frame_10._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  Sprite::encode((ByteArray *)&local_5c0,(Sprite *)local_590);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_5a8,&local_5c0);
  md::ROM::set_bytes((ROM *)pSVar2,0x12bdfe,&local_5a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_5a8);
  ByteArray::~ByteArray((ByteArray *)&local_5c0);
  Sprite::~Sprite((Sprite *)local_590);
  Sprite::~Sprite((Sprite *)local_500);
  Sprite::~Sprite((Sprite *)local_3e0);
  Sprite::~Sprite((Sprite *)local_380);
  Sprite::~Sprite((Sprite *)local_320);
  Sprite::~Sprite((Sprite *)local_2c0);
  Sprite::~Sprite((Sprite *)local_260);
  Sprite::~Sprite((Sprite *)local_200);
  Sprite::~Sprite((Sprite *)local_170);
  Sprite::~Sprite((Sprite *)local_110);
  Sprite::~Sprite((Sprite *)local_b0);
  Sprite::~Sprite((Sprite *)local_40);
  return;
}

Assistant:

static void fix_sword_shade(md::ROM& rom)
    {
        fix_sword_shade_frame(rom, 0x1220AE, 11); // SpriteGfx000Frame02
        fix_sword_shade_frame(rom, 0x122A7C, 11); // SpriteGfx000Frame06
        fix_sword_shade_frame(rom, 0x122D1A, 11); // SpriteGfx000Frame07
        fix_sword_shade_frame(rom, 0x122F62, 11); // SpriteGfx000Frame08
        fix_sword_shade_frame(rom, 0x1231A0, 11); // SpriteGfx000Frame09

        Sprite nigel_frame_10 = Sprite::decode_from(rom.iterator_at(0x1233A8));
        nigel_frame_10.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_10.set_pixel(10, 7, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_10.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1233A8, nigel_frame_10.encode());

        fix_sword_shade_frame(rom, 0x123626, 11); // SpriteGfx000Frame11
        fix_sword_shade_frame(rom, 0x123FA8, 11); // SpriteGfx000Frame15

        Sprite nigel_frame_16 = Sprite::decode_from(rom.iterator_at(0x124200));
        nigel_frame_16.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_16.set_pixel(11, 0, 2, COLOR_SWORD_WRONG);
        rom.set_bytes(0x124200, nigel_frame_16.encode());

        Sprite nigel_frame_18 = Sprite::decode_from(rom.iterator_at(0x124694));
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 6);
        nigel_frame_18.set_pixel(10, 3, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x124694, nigel_frame_18.encode());

        fix_sword_shade_frame(rom, 0x12493C, 11); // SpriteGfx000Frame19
        fix_sword_shade_frame(rom, 0x124BE2, 11); // SpriteGfx000Frame20

        // --- Anim dropping held item, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x12510A, 15); // SpriteGfx000Frame22

        Sprite nigel_frame_23 = Sprite::decode_from(rom.iterator_at(0x125370));
        nigel_frame_23.set_pixel(15, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 5, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 2, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x125370, nigel_frame_23.encode());

        // --- Anim held item, not looking camera ----------------------------
        fix_sword_shade_frame(rom, 0x125616, 11); // SpriteGfx000Frame24
        fix_sword_shade_frame(rom, 0x1258C2, {10, 11}); // SpriteGfx000Frame25
        fix_sword_shade_frame(rom, 0x125B70, 11); // SpriteGfx000Frame26
        fix_sword_shade_frame(rom, 0x125E24, 11); // SpriteGfx000Frame27
        fix_sword_shade_frame(rom, 0x1260DA, 11); // SpriteGfx000Frame28
        fix_sword_shade_frame(rom, 0x126374, 11); // SpriteGfx000Frame29
        fix_sword_shade_frame(rom, 0x1265E8, 11); // SpriteGfx000Frame30
        fix_sword_shade_frame(rom, 0x126866, 11); // SpriteGfx000Frame31

        // --- Anim held item, facing camera ----------------------------
        Sprite nigel_frame_32 = Sprite::decode_from(rom.iterator_at(0x126AC4));
        nigel_frame_32.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126AC4, nigel_frame_32.encode());

        Sprite nigel_frame_33 = Sprite::decode_from(rom.iterator_at(0x126D66));
        nigel_frame_33.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_33.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126D66, nigel_frame_33.encode());

        fix_sword_shade_frame(rom, 0x12700C, 11); // SpriteGfx000Frame34

        Sprite nigel_frame_35 = Sprite::decode_from(rom.iterator_at(0x1272AC));
        nigel_frame_35.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_35.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x1272AC, nigel_frame_35.encode());

        Sprite nigel_frame_36 = Sprite::decode_from(rom.iterator_at(0x127546));
        nigel_frame_36.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127546, nigel_frame_36.encode());

        Sprite nigel_frame_37 = Sprite::decode_from(rom.iterator_at(0x1277D0));
        nigel_frame_37.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(10, 6, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(11, 4, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1277D0, nigel_frame_37.encode());

        fix_sword_shade_frame(rom, 0x127A50, 11); // SpriteGfx000Frame38

        Sprite nigel_frame_39 = Sprite::decode_from(rom.iterator_at(0x127CC8));
        nigel_frame_39.set_pixel(11, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 5, 2, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 4, 3, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127CC8, nigel_frame_39.encode());

        // --- Anim jumping, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x127F28, 10); // SpriteGfx000Frame40
        fix_sword_shade_frame(rom, 0x128126, 10); // SpriteGfx000Frame41

        // --- Anim jumping, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128340, 10); // SpriteGfx000Frame42
        fix_sword_shade_frame(rom, 0x12859A, {10, 11}); // SpriteGfx000Frame43

        // --- Anim jumping holding something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1287FA, 10); // SpriteGfx000Frame44
        fix_sword_shade_frame(rom, 0x128A10, 10); // SpriteGfx000Frame45

        // --- Anim jumping holding something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128C36, 10); // SpriteGfx000Frame46
        fix_sword_shade_frame(rom, 0x128E6C, {10, 11}); // SpriteGfx000Frame47

        // --- Anim jumping throwing something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1290C4, {10, 14, 15}); // SpriteGfx000Frame48
        fix_sword_shade_frame(rom, 0x129324, 10); // SpriteGfx000Frame49

        // --- Anim jumping throwing something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x1295D2, {6, 10, 11}); // SpriteGfx000Frame50

        // --- Anim climbing, not looking at camera ----------------------------
        Sprite nigel_frame_60 = Sprite::decode_from(rom.iterator_at(0x12B990));
        nigel_frame_60.set_pixel(10, 1, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12B990, nigel_frame_60.encode());

        fix_sword_shade_frame(rom, 0x12BB9E, {10, 11}); // SpriteGfx000Frame61

        Sprite nigel_frame_62 = Sprite::decode_from(rom.iterator_at(0x12BDFE));
        nigel_frame_62.set_pixel(10, 2, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_62.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12BDFE, nigel_frame_62.encode());
    }